

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_compile_commands.cxx
# Opt level: O0

int main(void)

{
  bool bVar1;
  TranslationUnitsType *pTVar2;
  pointer pCVar3;
  char *pcVar4;
  ostream *poVar5;
  reference pvVar6;
  allocator local_311;
  string local_310;
  allocator local_2e9;
  string local_2e8;
  undefined1 local_2c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  const_iterator end;
  const_iterator it;
  undefined1 local_290 [8];
  CompileCommandParser parser;
  ifstream file;
  
  std::ifstream::ifstream(&parser.Input,"compile_commands.json",_S_in);
  CompileCommandParser::CompileCommandParser
            ((CompileCommandParser *)local_290,(ifstream *)&parser.Input);
  CompileCommandParser::Parse((CompileCommandParser *)local_290);
  pTVar2 = CompileCommandParser::GetTranslationUnits((CompileCommandParser *)local_290);
  end = std::
        vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
        ::begin(pTVar2);
  pTVar2 = CompileCommandParser::GetTranslationUnits((CompileCommandParser *)local_290);
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
                ::end(pTVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<const_CompileCommandParser::CommandType_*,_std::vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>_>
                             *)&command.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      CompileCommandParser::~CompileCommandParser((CompileCommandParser *)local_290);
      std::ifstream::~ifstream(&parser.Input);
      return 0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2c8);
    pCVar3 = __gnu_cxx::
             __normal_iterator<const_CompileCommandParser::CommandType_*,_std::vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>_>
             ::operator->(&end);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2e8,"command",&local_2e9);
    CompileCommandParser::CommandType::at(pCVar3,&local_2e8);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::ParseUnixCommandLine
              (pcVar4,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    pCVar3 = __gnu_cxx::
             __normal_iterator<const_CompileCommandParser::CommandType_*,_std::vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>_>
             ::operator->(&end);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_310,"directory",&local_311);
    CompileCommandParser::CommandType::at(pCVar3,&local_310);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmSystemTools::RunSingleCommand
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2c8,(string *)0x0,(string *)0x0,(int *)0x0,pcVar4,OUTPUT_MERGE,0.0);
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator((allocator<char> *)&local_311);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2c8);
    __gnu_cxx::
    __normal_iterator<const_CompileCommandParser::CommandType_*,_std::vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>_>
    ::operator++(&end);
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"ERROR: Failed to run command \"");
  pvVar6 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2c8,0);
  poVar5 = std::operator<<(poVar5,(string *)pvVar6);
  poVar5 = std::operator<<(poVar5,"\"");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

int main ()
{
  std::ifstream file("compile_commands.json");
  CompileCommandParser parser(&file);
  parser.Parse();
  for(CompileCommandParser::TranslationUnitsType::const_iterator
      it = parser.GetTranslationUnits().begin(),
      end = parser.GetTranslationUnits().end(); it != end; ++it)
    {
    std::vector<std::string> command;
    cmSystemTools::ParseUnixCommandLine(it->at("command").c_str(), command);
    if (!cmSystemTools::RunSingleCommand(
            command, 0, 0, 0, it->at("directory").c_str()))
      {
      std::cout << "ERROR: Failed to run command \""
                << command[0] << "\"" << std::endl;
      exit(1);
      }
    }
  return 0;
}